

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

void __thiscall OpenMD::StuntDouble::setA(StuntDouble *this,RotMat3x3d *a)

{
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)
             ((long)this->localIndex_ * 0x48 +
             *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).aMat.
                              super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + this->storage_)),
             (RectMatrix<double,_3U,_3U> *)a);
  return;
}

Assistant:

virtual void setA(const RotMat3x3d& a) {
      ((snapshotMan_->getCurrentSnapshot())->*storage_).aMat[localIndex_] = a;
    }